

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

Change * __thiscall Patch::change_for_root_node(Change *__return_storage_ptr__,Patch *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Node *pNVar3;
  uint32_t uVar4;
  Point PVar5;
  Point PVar6;
  Point new_start;
  Point old_start;
  Point local_48;
  Point local_40;
  Text *local_38;
  Text *pTStack_30;
  
  pNVar3 = this->root;
  local_40 = pNVar3->old_distance_from_left_ancestor;
  local_48 = pNVar3->new_distance_from_left_ancestor;
  PVar5 = Point::traverse(&local_40,&pNVar3->old_extent);
  PVar6 = Point::traverse(&local_48,&this->root->new_extent);
  pNVar3 = this->root;
  local_38 = (pNVar3->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
             super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  pTStack_30 = (pNVar3->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
               super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
               super__Head_base<0UL,_Text_*,_false>._M_head_impl;
  uVar4 = Node::old_text_size(pNVar3);
  pNVar3 = this->root->left;
  if (pNVar3 == (Node *)0x0) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    uVar1 = pNVar3->old_subtree_text_size;
    uVar2 = pNVar3->new_subtree_text_size;
  }
  __return_storage_ptr__->old_start = local_40;
  __return_storage_ptr__->old_end = PVar5;
  __return_storage_ptr__->new_start = local_48;
  __return_storage_ptr__->new_end = PVar6;
  __return_storage_ptr__->old_text = local_38;
  __return_storage_ptr__->new_text = pTStack_30;
  __return_storage_ptr__->preceding_old_text_size = uVar1;
  __return_storage_ptr__->preceding_new_text_size = uVar2;
  __return_storage_ptr__->old_text_size = uVar4;
  return __return_storage_ptr__;
}

Assistant:

Change Patch::change_for_root_node() {
  Point old_start = root->old_distance_from_left_ancestor;
  Point new_start = root->new_distance_from_left_ancestor;
  Point old_end = old_start.traverse(root->old_extent);
  Point new_end = new_start.traverse(root->new_extent);
  Text *old_text = root->old_text.get();
  Text *new_text = root->new_text.get();
  uint32_t old_text_size = root->old_text_size();
  uint32_t preceding_old_text_size = root->left_subtree_old_text_size();
  uint32_t preceding_new_text_size = root->left_subtree_new_text_size();
  return Change{
    old_start,
    old_end,
    new_start,
    new_end,
    old_text,
    new_text,
    preceding_old_text_size,
    preceding_new_text_size,
    old_text_size,
  };
}